

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
               (interval_t *idata,AggregateInputData *aggr_input_data,IntervalAvgState **states,
               ValidityMask *mask,idx_t count)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  IntervalAvgState *pIVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  int64_t *piVar14;
  unsigned_long uVar15;
  interval_t iVar16;
  interval_t right;
  interval_t right_00;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = &idata->micros;
      iVar12 = 0;
      do {
        pIVar5 = states[iVar12];
        pIVar5->count = pIVar5->count + 1;
        uVar3 = ((interval_t *)(local_68 + -1))->months;
        uVar8 = ((interval_t *)(local_68 + -1))->days;
        iVar16.days = uVar8;
        iVar16.months = uVar3;
        iVar16.micros = *local_68;
        iVar16 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (pIVar5->value,iVar16);
        pIVar5->value = iVar16;
        iVar12 = iVar12 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar4[uVar9];
      }
      uVar13 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar13 = count;
      }
      uVar11 = uVar13;
      if (uVar15 != 0) {
        uVar11 = uVar10;
        if (uVar15 == 0xffffffffffffffff) {
          if (uVar10 < uVar13) {
            piVar14 = &idata[uVar10].micros;
            do {
              pIVar5 = states[uVar11];
              pIVar5->count = pIVar5->count + 1;
              uVar1 = ((interval_t *)(piVar14 + -1))->months;
              uVar6 = ((interval_t *)(piVar14 + -1))->days;
              right.days = uVar6;
              right.months = uVar1;
              right.micros = *piVar14;
              iVar16 = AddOperator::
                       Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                 (pIVar5->value,right);
              pIVar5->value = iVar16;
              uVar11 = uVar11 + 1;
              piVar14 = piVar14 + 2;
            } while (uVar13 != uVar11);
          }
        }
        else if (uVar10 < uVar13) {
          piVar14 = &idata[uVar10].micros;
          uVar11 = 0;
          do {
            if ((uVar15 >> (uVar11 & 0x3f) & 1) != 0) {
              pIVar5 = states[uVar10 + uVar11];
              pIVar5->count = pIVar5->count + 1;
              uVar2 = ((interval_t *)(piVar14 + -1))->months;
              uVar7 = ((interval_t *)(piVar14 + -1))->days;
              right_00.days = uVar7;
              right_00.months = uVar2;
              right_00.micros = *piVar14;
              iVar16 = AddOperator::
                       Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                 (pIVar5->value,right_00);
              pIVar5->value = iVar16;
            }
            uVar11 = uVar11 + 1;
            piVar14 = piVar14 + 2;
          } while ((uVar10 - uVar13) + uVar11 != 0);
          uVar11 = uVar10 + uVar11;
        }
      }
      uVar9 = uVar9 + 1;
      uVar10 = uVar11;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}